

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

fasttext_vocab_t * cft_fasttext_get_vocab(fasttext_t *handle)

{
  fasttext_vocab_t *pfVar1;
  char **ppcVar2;
  int64_t *piVar3;
  char *pcVar4;
  pointer plVar5;
  pointer plVar6;
  int32_t i;
  ulong uVar7;
  size_t __size;
  vector<long,_std::allocator<long>_> vocab_freq;
  shared_ptr<const_fasttext::Dictionary> d;
  string word;
  
  fasttext::FastText::getDictionary((FastText *)&d);
  fasttext::Dictionary::getCounts
            (&vocab_freq,
             d.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             word);
  plVar6 = vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar5 = vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __size = (long)vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  pfVar1 = (fasttext_vocab_t *)malloc(0x18);
  pfVar1->length = (long)__size >> 3;
  ppcVar2 = (char **)malloc(__size);
  piVar3 = (int64_t *)malloc(__size);
  for (uVar7 = 0; uVar7 < (ulong)((long)plVar6 - (long)plVar5 >> 3); uVar7 = uVar7 + 1) {
    fasttext::Dictionary::getWord_abi_cxx11_
              (&word,d.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(int32_t)uVar7);
    pcVar4 = strdup(word._M_dataplus._M_p);
    ppcVar2[uVar7] = pcVar4;
    piVar3[uVar7] =
         vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar7];
    std::__cxx11::string::~string((string *)&word);
    plVar5 = vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar6 = vocab_freq.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pfVar1->words = ppcVar2;
  pfVar1->freqs = piVar3;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&vocab_freq.super__Vector_base<long,_std::allocator<long>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&d.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return pfVar1;
}

Assistant:

fasttext_vocab_t* cft_fasttext_get_vocab(fasttext_t* handle) {
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::vector<int64_t> vocab_freq = d->getCounts(fasttext::entry_type::word);
    size_t len = vocab_freq.size();

    fasttext_vocab_t* ret = static_cast<fasttext_vocab_t*>(malloc(sizeof(fasttext_vocab_t)));
    ret->length = len;
    char** words = static_cast<char**>(malloc(sizeof(char*) * len));
    int64_t* freqs = static_cast<int64_t*>(malloc(sizeof(int64_t) * len));
    for (int32_t i = 0; i < vocab_freq.size(); i++) {
        std::string word = d->getWord(i);
        words[i] = strdup(word.c_str());
        freqs[i] = vocab_freq[i];
    }
    ret->words = words;
    ret->freqs = freqs;
    return ret;
}